

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

Id __thiscall
dxil_spv::Converter::Impl::get_physical_pointer_block_type
          (Impl *this,Id base_type_id,PhysicalPointerMeta *meta)

{
  pointer *ppPVar1;
  pointer *ppuVar2;
  byte bVar3;
  uint32_t uVar4;
  iterator __position;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  Id IVar9;
  long lVar10;
  Builder *pBVar11;
  Builder *pBVar12;
  uint uVar13;
  Op OVar14;
  long lVar15;
  pointer pPVar16;
  pointer pPVar17;
  Impl *pIVar18;
  char *pcVar19;
  uint __len;
  pointer pPVar20;
  pointer pPVar21;
  string __str;
  String type;
  Id local_84;
  pointer local_80;
  Impl *local_78;
  Vector<Id> local_70;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  
  pPVar17 = (this->physical_pointer_entries).
            super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar20 = (this->physical_pointer_entries).
            super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pPVar20 - (long)pPVar17;
  lVar15 = (lVar10 >> 2) * -0x3333333333333333 >> 2;
  local_84 = base_type_id;
  local_78 = this;
  if (0 < lVar15) {
    pPVar16 = pPVar17 + lVar15 * 4;
    lVar15 = lVar15 + 1;
    local_80 = pPVar20;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::__0>
                            *)meta,(PhysicalPointerEntry *)&local_84);
      pPVar20 = local_80;
      pPVar21 = pPVar17;
      if (bVar6) goto LAB_0011400e;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::__0>
                            *)meta,(PhysicalPointerEntry *)&local_84);
      pPVar20 = local_80;
      pPVar21 = pPVar17 + 1;
      if (bVar6) goto LAB_0011400e;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::__0>
                            *)meta,(PhysicalPointerEntry *)&local_84);
      pPVar20 = local_80;
      pPVar21 = pPVar17 + 2;
      if (bVar6) goto LAB_0011400e;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::__0>
                            *)meta,(PhysicalPointerEntry *)&local_84);
      pPVar20 = local_80;
      pPVar21 = pPVar17 + 3;
      if (bVar6) goto LAB_0011400e;
      pPVar17 = pPVar17 + 4;
      lVar15 = lVar15 + -1;
    } while (1 < lVar15);
    lVar10 = (long)local_80 - (long)pPVar16;
    pPVar17 = pPVar16;
  }
  lVar10 = (lVar10 >> 2) * -0x3333333333333333;
  if (lVar10 == 1) {
LAB_00113feb:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
            ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::__0>
                          *)meta,(PhysicalPointerEntry *)&local_84);
    pPVar21 = pPVar17;
    if (!bVar6) {
      pPVar21 = pPVar20;
    }
LAB_0011400e:
    if (pPVar21 != pPVar20) {
      return pPVar21->ptr_type_id;
    }
  }
  else {
    if (lVar10 == 2) {
LAB_00113fd3:
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::__0>
                            *)meta,(PhysicalPointerEntry *)&local_84);
      pPVar21 = pPVar17;
      if (!bVar6) {
        pPVar17 = pPVar17 + 1;
        goto LAB_00113feb;
      }
      goto LAB_0011400e;
    }
    if (lVar10 == 3) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::__0>
                            *)meta,(PhysicalPointerEntry *)&local_84);
      pPVar21 = pPVar17;
      if (!bVar6) {
        pPVar17 = pPVar17 + 1;
        goto LAB_00113fd3;
      }
      goto LAB_0011400e;
    }
  }
  pIVar18 = local_78;
  pBVar11 = SPIRVModule::get_builder(local_78->spirv_module);
  uVar7 = spv::Builder::getNumTypeConstituents(pBVar11,base_type_id);
  pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
  iVar8 = spv::Builder::getScalarTypeWidth(pBVar11,base_type_id);
  pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
  OVar14 = (pBVar11->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[base_type_id]->opCode;
  if (OVar14 == OpTypeVector) {
    pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
    pBVar12 = SPIRVModule::get_builder(pIVar18->spirv_module);
    IVar9 = spv::Builder::getScalarTypeId(pBVar12,base_type_id);
    OVar14 = (pBVar11->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[IVar9]->opCode;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
             &local_50,"PhysicalPointer","");
  if (OVar14 == OpTypeInt) {
    if (iVar8 == 0x10) {
      pcVar19 = "Ushort";
    }
    else if (iVar8 == 0x40) {
      pcVar19 = "Uint64";
    }
    else {
      if (iVar8 != 0x20) goto LAB_0011412a;
      pcVar19 = "Uint";
    }
  }
  else {
    if (OVar14 != OpTypeFloat) goto LAB_0011412a;
    if (iVar8 == 0x10) {
      pcVar19 = "Half";
    }
    else if (iVar8 == 0x40) {
      pcVar19 = "Double";
    }
    else {
      if (iVar8 != 0x20) goto LAB_0011412a;
      pcVar19 = "Float";
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append(&local_50,pcVar19);
LAB_0011412a:
  if (1 < (int)uVar7) {
    __len = 1;
    if (9 < uVar7) {
      uVar13 = uVar7;
      uVar5 = 4;
      do {
        __len = uVar5;
        if (uVar13 < 100) {
          __len = __len - 2;
          goto LAB_0011418a;
        }
        if (uVar13 < 1000) {
          __len = __len - 1;
          goto LAB_0011418a;
        }
        if (uVar13 < 10000) goto LAB_0011418a;
        bVar6 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        uVar5 = __len + 4;
      } while (bVar6);
      __len = __len + 1;
    }
LAB_0011418a:
    ppuVar2 = &local_70.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)ppuVar2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_70.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start,__len,uVar7);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&local_50,
             (char *)local_70.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    if ((pointer *)
        local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != ppuVar2) {
      operator_delete(local_70.
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  if (meta->nonwritable == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&local_50,"NonWrite");
  }
  if (meta->nonreadable == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&local_50,"NonRead");
  }
  if (meta->coherent == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&local_50,"Coherent");
  }
  IVar9 = base_type_id;
  if (meta->stride != '\0') {
    uVar4 = meta->size;
    pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
    if (uVar4 == 0) {
      IVar9 = spv::Builder::makeRuntimeArray(pBVar11,base_type_id);
      pcVar19 = "Array";
    }
    else {
      pBVar12 = SPIRVModule::get_builder(pIVar18->spirv_module);
      uVar7 = meta->size;
      bVar3 = meta->stride;
      IVar9 = spv::Builder::makeIntegerType(pBVar12,0x20,false);
      pIVar18 = local_78;
      IVar9 = spv::Builder::makeIntConstant(pBVar12,IVar9,uVar7 / bVar3,false);
      IVar9 = spv::Builder::makeArrayType(pBVar11,base_type_id,IVar9,(uint)meta->stride);
      pcVar19 = "CBVArray";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&local_50,pcVar19);
    pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
    spv::Builder::addDecoration(pBVar11,IVar9,DecorationArrayStride,(uint)meta->stride);
  }
  pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
  local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
  local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start + 1;
  *local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = IVar9;
  local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  IVar9 = spv::Builder::makeStructType(pBVar11,&local_70,local_50._M_dataplus._M_p);
  if (local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
    free_in_thread(local_70.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
  spv::Builder::addMemberDecoration(pBVar11,IVar9,0,DecorationOffset,0);
  pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
  spv::Builder::addMemberName(pBVar11,IVar9,0,"value");
  pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
  spv::Builder::addDecoration(pBVar11,IVar9,DecorationBlock,-1);
  if (meta->nonwritable == true) {
    pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
    spv::Builder::addMemberDecoration(pBVar11,IVar9,0,DecorationNonWritable,-1);
  }
  if (meta->nonreadable == true) {
    pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
    spv::Builder::addMemberDecoration(pBVar11,IVar9,0,DecorationNonReadable,-1);
  }
  if (meta->coherent == true) {
    pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
    spv::Builder::addMemberDecoration(pBVar11,IVar9,0,DecorationCoherent,-1);
  }
  pBVar11 = SPIRVModule::get_builder(pIVar18->spirv_module);
  IVar9 = spv::Builder::makePointer(pBVar11,StorageClassPhysicalStorageBuffer,IVar9);
  local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)CONCAT44(base_type_id,IVar9);
  local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_70.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,meta->size);
  local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = *(pointer *)meta;
  __position._M_current =
       (pIVar18->physical_pointer_entries).
       super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pIVar18->physical_pointer_entries).
      super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>>
    ::_M_realloc_insert<dxil_spv::Converter::Impl::PhysicalPointerEntry_const&>
              ((vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>>
                *)&pIVar18->physical_pointer_entries,__position,(PhysicalPointerEntry *)&local_70);
  }
  else {
    ((__position._M_current)->meta).size = meta->size;
    *(pointer *)__position._M_current =
         local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)&(__position._M_current)->meta =
         local_70.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    ppPVar1 = &(pIVar18->physical_pointer_entries).
               super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    free_in_thread(local_50._M_dataplus._M_p);
  }
  return IVar9;
}

Assistant:

spv::Id Converter::Impl::get_physical_pointer_block_type(spv::Id base_type_id, const PhysicalPointerMeta &meta)
{
	auto itr = std::find_if(physical_pointer_entries.begin(), physical_pointer_entries.end(), [&](const PhysicalPointerEntry &entry) {
		return entry.meta.coherent == meta.coherent &&
		       entry.meta.nonreadable == meta.nonreadable &&
		       entry.meta.nonwritable == meta.nonwritable &&
		       entry.meta.size == meta.size &&
		       entry.meta.stride == meta.stride &&
		       entry.base_type_id == base_type_id;
	});

	if (itr != physical_pointer_entries.end())
		return itr->ptr_type_id;

	int vecsize = builder().getNumTypeComponents(base_type_id);
	int width = builder().getScalarTypeWidth(base_type_id);

	spv::Op op = builder().getTypeClass(base_type_id);
	if (op == spv::OpTypeVector)
		op = builder().getTypeClass(builder().getScalarTypeId(base_type_id));

	String type = "PhysicalPointer";
	switch (op)
	{
	case spv::OpTypeFloat:
		if (width == 16)
			type += "Half";
		else if (width == 32)
			type += "Float";
		else if (width == 64)
			type += "Double";
		break;

	case spv::OpTypeInt:
		if (width == 16)
			type += "Ushort";
		else if (width == 32)
			type += "Uint";
		else if (width == 64)
			type += "Uint64";
		break;

	default:
		break;
	}

	if (vecsize > 1)
		type += std::to_string(vecsize).c_str();

	if (meta.nonwritable)
		type += "NonWrite";
	if (meta.nonreadable)
		type += "NonRead";
	if (meta.coherent)
		type += "Coherent";

	spv::Id type_id = base_type_id;

	if (meta.stride > 0)
	{
		if (meta.size == 0)
		{
			type_id = builder().makeRuntimeArray(type_id);
			type += "Array";
		}
		else
		{
			type_id = builder().makeArrayType(type_id, builder().makeUintConstant(meta.size / meta.stride),
			                                  meta.stride);
			type += "CBVArray";
		}
		builder().addDecoration(type_id, spv::DecorationArrayStride, meta.stride);
	}

	spv::Id block_type_id = builder().makeStructType({ type_id }, type.c_str());
	builder().addMemberDecoration(block_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberName(block_type_id, 0, "value");
	builder().addDecoration(block_type_id, spv::DecorationBlock);

	if (meta.nonwritable)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonWritable);
	if (meta.nonreadable)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonReadable);
	if (meta.coherent)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationCoherent);

	spv::Id ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, block_type_id);
	PhysicalPointerEntry new_entry = {};
	new_entry.ptr_type_id = ptr_type_id;
	new_entry.base_type_id = base_type_id;
	new_entry.meta = meta;
	physical_pointer_entries.push_back(new_entry);
	return ptr_type_id;
}